

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::dht_direct_response_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,dht_direct_response_alert *this)

{
  char *pcVar1;
  bool bVar2;
  address local_498;
  string local_478;
  undefined1 *local_458 [2];
  undefined1 local_448 [16];
  char msg [1050];
  
  bVar2 = (this->endpoint).super_basic_endpoint<boost::asio::ip::udp>.impl_.data_.base.sa_family !=
          2;
  if (bVar2) {
    local_498.ipv6_address_.addr_.__in6_u._0_8_ =
         *(undefined8 *)
          ((long)&(this->endpoint).super_basic_endpoint<boost::asio::ip::udp>.impl_.data_ + 8);
    local_498.ipv6_address_.addr_.__in6_u._8_8_ =
         *(undefined8 *)
          ((long)&(this->endpoint).super_basic_endpoint<boost::asio::ip::udp>.impl_.data_ + 0x10);
    local_498.ipv6_address_.scope_id_ =
         (unsigned_long)
         (this->endpoint).super_basic_endpoint<boost::asio::ip::udp>.impl_.data_.v6.sin6_scope_id;
    local_498.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
  }
  else {
    local_498.ipv4_address_.addr_.s_addr =
         (in4_addr_type)
         (this->endpoint).super_basic_endpoint<boost::asio::ip::udp>.impl_.data_.v4.sin_addr.s_addr;
    local_498.ipv6_address_.addr_.__in6_u._0_8_ = 0;
    local_498.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    local_498.ipv6_address_.scope_id_ = 0;
  }
  local_498.type_ = (anon_enum_32)bVar2;
  boost::asio::ip::address::to_string_abi_cxx11_(&local_478,&local_498);
  if (this->m_response_size == 0) {
    snprintf(msg,0x41a,"DHT direct response (address=%s) [ %s ]",local_478._M_dataplus._M_p,"");
  }
  else {
    pcVar1 = aux::stack_allocator::ptr
                       ((this->m_alloc)._M_data,(allocation_slot)(this->m_response_idx).m_idx);
    local_458[0] = local_448;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_458,pcVar1,pcVar1 + this->m_response_size);
    snprintf(msg,0x41a,"DHT direct response (address=%s) [ %s ]",local_478._M_dataplus._M_p,
             local_458[0]);
    ::std::__cxx11::string::~string((string *)local_458);
  }
  ::std::__cxx11::string::~string((string *)&local_478);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,msg,(allocator<char> *)&local_478);
  return __return_storage_ptr__;
}

Assistant:

std::string dht_direct_response_alert::message() const
	{
#ifdef TORRENT_DISABLE_ALERT_MSG
		return {};
#else
		char msg[1050];
		std::snprintf(msg, sizeof(msg), "DHT direct response (address=%s) [ %s ]"
			, endpoint.address().to_string().c_str()
			, m_response_size ? std::string(m_alloc.get().ptr(m_response_idx)
				, aux::numeric_cast<std::size_t>(m_response_size)).c_str() : "");
		return msg;
#endif
	}